

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86.cpp
# Opt level: O0

void ncnn::original_pre_calc_for_bilinear_interpolate<float>
               (int height,int width,int pooled_height,int pooled_width,float roi_start_h,
               float roi_start_w,float bin_size_h,float bin_size_w,int sampling_ratio,
               vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *pre_calc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  reference pvVar6;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  size_type __n;
  int in_EDI;
  int in_R8D;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *in_R9;
  float in_XMM0_Da;
  float fVar7;
  double dVar8;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  PreCalc<float> pc;
  float b1;
  float b0;
  float a1;
  float a0;
  int y1;
  int y0;
  int x1;
  int x0;
  float x;
  int bx;
  float y;
  int by;
  int bin_grid_w;
  int bin_grid_h;
  float wend;
  float hend;
  float wstart;
  float hstart;
  int pw;
  int ph;
  int pre_calc_index;
  float local_cc;
  float local_c8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  int local_94;
  int local_8c;
  int local_80;
  int local_78;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  int local_3c;
  int local_38;
  int local_34;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *local_30;
  int local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_34 = 0;
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_XMM3_Da;
  local_1c = in_XMM2_Da;
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  local_10 = in_ECX;
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  for (local_38 = 0; local_38 < local_c; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < local_10; local_3c = local_3c + 1) {
      local_40 = local_14 + (float)local_38 * local_1c;
      local_44 = local_18 + (float)local_3c * local_20;
      local_48 = local_14 + (float)(local_38 + 1) * local_1c;
      local_4c = local_18 + (float)(local_3c + 1) * local_20;
      local_50 = 0.0;
      pfVar5 = std::max<float>(&local_40,&local_50);
      local_54 = (float)local_4;
      pfVar5 = std::min<float>(pfVar5,&local_54);
      local_40 = *pfVar5;
      local_58 = 0.0;
      pfVar5 = std::max<float>(&local_44,&local_58);
      local_5c = (float)local_8;
      pfVar5 = std::min<float>(pfVar5,&local_5c);
      local_44 = *pfVar5;
      local_60 = 0.0;
      pfVar5 = std::max<float>(&local_48,&local_60);
      local_64 = (float)local_4;
      pfVar5 = std::min<float>(pfVar5,&local_64);
      local_48 = *pfVar5;
      local_68 = 0.0;
      pfVar5 = std::max<float>(&local_4c,&local_68);
      local_6c = (float)local_8;
      pfVar5 = std::min<float>(pfVar5,&local_6c);
      local_4c = *pfVar5;
      if (local_24 < 1) {
        dVar8 = std::ceil((double)(ulong)(uint)(local_48 - local_40));
        local_c8 = SUB84(dVar8,0);
      }
      else {
        local_c8 = (float)local_24;
      }
      if (local_24 < 1) {
        dVar8 = std::ceil((double)(ulong)(uint)(local_4c - local_44));
        local_cc = SUB84(dVar8,0);
      }
      else {
        local_cc = (float)local_24;
      }
      for (local_78 = 0; local_78 < (int)local_c8; local_78 = local_78 + 1) {
        fVar7 = local_40 + (((float)local_78 + 0.5) * local_1c) / (float)(int)local_c8;
        for (local_80 = 0; local_80 < (int)local_cc; local_80 = local_80 + 1) {
          local_9c = local_44 + (((float)local_80 + 0.5) * local_20) / (float)(int)local_cc;
          iVar1 = (int)local_9c;
          local_8c = iVar1 + 1;
          iVar2 = (int)fVar7;
          local_94 = iVar2 + 1;
          local_98 = (float)local_8c - local_9c;
          local_9c = local_9c - (float)iVar1;
          local_a0 = (float)local_94 - fVar7;
          local_a4 = fVar7 - (float)iVar2;
          if (local_8 <= local_8c) {
            local_8c = local_8 + -1;
            local_98 = 1.0;
            local_9c = 0.0;
          }
          if (local_4 <= local_94) {
            local_94 = local_4 + -1;
            local_a0 = 1.0;
            local_a4 = 0.0;
          }
          iVar3 = iVar2 * local_8;
          iVar2 = iVar2 * local_8;
          iVar4 = local_94 * local_8;
          local_94 = local_94 * local_8;
          __n = (size_type)local_34;
          local_34 = local_34 + 1;
          pvVar6 = std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::
                   operator[](local_30,__n);
          pvVar6->pos1 = iVar3 + iVar1;
          pvVar6->pos2 = iVar2 + local_8c;
          pvVar6->pos3 = iVar4 + iVar1;
          pvVar6->pos4 = local_94 + local_8c;
          pvVar6->w1 = local_98 * local_a0;
          pvVar6->w2 = local_9c * local_a0;
          pvVar6->w3 = local_98 * local_a4;
          pvVar6->w4 = local_9c * local_a4;
        }
      }
    }
  }
  return;
}

Assistant:

void original_pre_calc_for_bilinear_interpolate(
    const int height,
    const int width,
    const int pooled_height,
    const int pooled_width,
    T roi_start_h,
    T roi_start_w,
    T bin_size_h,
    T bin_size_w,
    int sampling_ratio,
    std::vector<PreCalc<T> >& pre_calc)
{
    int pre_calc_index = 0;
    for (int ph = 0; ph < pooled_height; ph++)
    {
        for (int pw = 0; pw < pooled_width; pw++)
        {
            float hstart = roi_start_h + ph * bin_size_h;
            float wstart = roi_start_w + pw * bin_size_w;
            float hend = roi_start_h + (ph + 1) * bin_size_h;
            float wend = roi_start_w + (pw + 1) * bin_size_w;
            hstart = std::min(std::max(hstart, 0.f), (float)height);
            wstart = std::min(std::max(wstart, 0.f), (float)width);
            hend = std::min(std::max(hend, 0.f), (float)height);
            wend = std::min(std::max(wend, 0.f), (float)width);

            int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
            int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

            for (int by = 0; by < bin_grid_h; by++)
            {
                float y = hstart + (by + 0.5f) * bin_size_h / (float)bin_grid_h;

                for (int bx = 0; bx < bin_grid_w; bx++)
                {
                    float x = wstart + (bx + 0.5f) * bin_size_w / (float)bin_grid_w;
                    int x0 = (int)x;
                    int x1 = x0 + 1;
                    int y0 = (int)y;
                    int y1 = y0 + 1;

                    float a0 = x1 - x;
                    float a1 = x - x0;
                    float b0 = y1 - y;
                    float b1 = y - y0;

                    if (x1 >= width)
                    {
                        x1 = width - 1;
                        a0 = 1.f;
                        a1 = 0.f;
                    }
                    if (y1 >= height)
                    {
                        y1 = height - 1;
                        b0 = 1.f;
                        b1 = 0.f;
                    }
                    // save weights and indices
                    PreCalc<T> pc;
                    pc.pos1 = y0 * width + x0;
                    pc.pos2 = y0 * width + x1;
                    pc.pos3 = y1 * width + x0;
                    pc.pos4 = y1 * width + x1;
                    pc.w1 = a0 * b0;
                    pc.w2 = a1 * b0;
                    pc.w3 = a0 * b1;
                    pc.w4 = a1 * b1;
                    pre_calc[pre_calc_index++] = pc;
                }
            }
        }
    }
}